

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_retry_request(Curl_easy *data,char **url)

{
  undefined1 *puVar1;
  int iVar2;
  connectdata *conn;
  curl_trc_feat *pcVar3;
  uint uVar4;
  char *pcVar5;
  CURLcode CVar6;
  
  conn = data->conn;
  *url = (char *)0x0;
  uVar4 = *(uint *)&(data->state).field_0x744;
  if (((uVar4 >> 0x11 & 1) == 0) || ((conn->handler->protocol & 0x40003) != 0)) {
    CVar6 = CURLE_OK;
    if ((ulong)(data->req).headerbytecount + (data->req).bytecount == 0) {
      if ((((ulong)conn->bits & 0x40) == 0) ||
         (((((data->req).field_0xdb & 2) != 0 && ((conn->handler->protocol & 3) == 0)) ||
          ((data->set).rtspreq == RTSPREQ_RECEIVE)))) {
        if ((uVar4 & 4) == 0) {
          return CURLE_OK;
        }
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))
           )) {
          Curl_infof(data,"REFUSED_STREAM, retrying a fresh connect");
          uVar4 = *(uint *)&(data->state).field_0x744;
        }
        *(uint *)&(data->state).field_0x744 = uVar4 & 0xfffffffb;
      }
      iVar2 = (data->state).retrycount;
      (data->state).retrycount = iVar2 + 1;
      if (iVar2 < 5) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))
           )) {
          Curl_infof(data,"Connection died, retrying a fresh connect (retry count: %d)");
        }
        pcVar5 = (*Curl_cstrdup)((data->state).url);
        *url = pcVar5;
        if (pcVar5 == (char *)0x0) {
          CVar6 = CURLE_OUT_OF_MEMORY;
        }
        else {
          Curl_conncontrol(conn,1);
          puVar1 = &(conn->bits).field_0x1;
          *puVar1 = *puVar1 | 0x40;
          Curl_creader_set_rewind(data,true);
          CVar6 = CURLE_OK;
        }
      }
      else {
        Curl_failf(data,"Connection died, tried %d times before giving up",5);
        (data->state).retrycount = 0;
        CVar6 = CURLE_SEND_ERROR;
      }
    }
  }
  else {
    CVar6 = CURLE_OK;
  }
  return CVar6;
}

Assistant:

CURLcode Curl_retry_request(struct Curl_easy *data, char **url)
{
  struct connectdata *conn = data->conn;
  bool retry = FALSE;
  *url = NULL;

  /* if we are talking upload, we cannot do the checks below, unless the
     protocol is HTTP as when uploading over HTTP we will still get a
     response */
  if(data->state.upload &&
     !(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)))
    return CURLE_OK;

  if((data->req.bytecount + data->req.headerbytecount == 0) &&
     conn->bits.reuse &&
     (!data->req.no_body || (conn->handler->protocol & PROTO_FAMILY_HTTP))
#ifndef CURL_DISABLE_RTSP
     && (data->set.rtspreq != RTSPREQ_RECEIVE)
#endif
    )
    /* We got no data, we attempted to reuse a connection. For HTTP this
       can be a retry so we try again regardless if we expected a body.
       For other protocols we only try again only if we expected a body.

       This might happen if the connection was left alive when we were
       done using it before, but that was closed when we wanted to read from
       it again. Bad luck. Retry the same request on a fresh connect! */
    retry = TRUE;
  else if(data->state.refused_stream &&
          (data->req.bytecount + data->req.headerbytecount == 0) ) {
    /* This was sent on a refused stream, safe to rerun. A refused stream
       error can typically only happen on HTTP/2 level if the stream is safe
       to issue again, but the nghttp2 API can deliver the message to other
       streams as well, which is why this adds the check the data counters
       too. */
    infof(data, "REFUSED_STREAM, retrying a fresh connect");
    data->state.refused_stream = FALSE; /* clear again */
    retry = TRUE;
  }
  if(retry) {
#define CONN_MAX_RETRIES 5
    if(data->state.retrycount++ >= CONN_MAX_RETRIES) {
      failf(data, "Connection died, tried %d times before giving up",
            CONN_MAX_RETRIES);
      data->state.retrycount = 0;
      return CURLE_SEND_ERROR;
    }
    infof(data, "Connection died, retrying a fresh connect (retry count: %d)",
          data->state.retrycount);
    *url = strdup(data->state.url);
    if(!*url)
      return CURLE_OUT_OF_MEMORY;

    connclose(conn, "retry"); /* close this connection */
    conn->bits.retry = TRUE; /* mark this as a connection we are about
                                to retry. Marking it this way should
                                prevent i.e HTTP transfers to return
                                error just because nothing has been
                                transferred! */
    Curl_creader_set_rewind(data, TRUE);
  }
  return CURLE_OK;
}